

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quasiquote_conversion.cpp
# Opt level: O2

cell * __thiscall
skiwi::anon_unknown_26::quasiquote_conversion_visitor::tag_data
          (cell *__return_storage_ptr__,quasiquote_conversion_visitor *this,cell *c)

{
  _func_int **pp_Var1;
  uint __line;
  bool bVar2;
  cell *pcVar3;
  char *__assertion;
  
  pcVar3 = (cell *)this;
  bVar2 = tag_is_backquote(this,(cell *)this);
  if (!bVar2) {
    bVar2 = tag_is_comma(this,pcVar3);
    if (!bVar2) {
      bVar2 = tag_is_comma_atsign(this,pcVar3);
      if (!bVar2) {
        __assertion = "tag_is_backquote(c) || tag_is_comma(c) || tag_is_comma_atsign(c)";
        __line = 0x41;
        goto LAB_00247b18;
      }
    }
  }
  pp_Var1 = this[5].super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>.
            _vptr_base_visitor;
  if (pp_Var1[2] < (_func_int *)0x4) {
    pcVar3 = (cell *)(pp_Var1 + 0xb);
  }
  else {
    bVar2 = operator==((cell *)(pp_Var1[0x10] + 0x58),(cell *)skiwi::nil_sym);
    if (!bVar2) {
      __assertion = "0";
      __line = 0x47;
LAB_00247b18:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]skiwi/libskiwi/quasiquote_conversion.cpp"
                    ,__line,
                    "cell skiwi::(anonymous namespace)::quasiquote_conversion_visitor::tag_data(const cell &)"
                   );
    }
    pcVar3 = (cell *)this[5].
                     super_base_visitor<skiwi::(anonymous_namespace)::quasiquote_conversion_visitor>
                     ._vptr_base_visitor[0x10];
  }
  cell::cell(__return_storage_ptr__,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

cell tag_data(const cell& c)
      {
      assert(tag_is_backquote(c) || tag_is_comma(c) || tag_is_comma_atsign(c));
      if (c.pair[0].value.length() > 3) // quasiquote, unquote, or unquote-splicing
        {
        if (c.pair[1].pair[1] == nil_sym)
          return c.pair[1].pair[0];
        else
          assert(0);
        }
      return c.pair[1];
      }